

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceObjectArchive::Merge(DeviceObjectArchive *this,DeviceObjectArchive *Src)

{
  int iVar1;
  pointer pSVar2;
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *pvVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  _Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
  _Var7;
  char *pcVar8;
  char (*Args_1) [14];
  uint *Idx;
  DeviceObjectArchive *pDVar9;
  _Prime_rehash_policy *this_00;
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *pvVar10;
  ulong uVar11;
  char *in_R8;
  pointer pSVar12;
  long lVar13;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>,_bool>
  pVar14;
  Serializer<(Diligent::SerializerMode)0> Ser;
  Uint32 ShaderIndex;
  ShaderIndexArray ShaderIndices;
  char *ResName;
  string _msg;
  DynamicLinearAllocator DynAllocator;
  array<unsigned_int,_7UL> ShaderBaseIndices;
  char (*in_stack_fffffffffffffe08) [3];
  undefined1 local_1f0 [16];
  char *pcStack_1e0;
  array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
  *local_1d8;
  DeviceObjectArchive *local_1d0;
  Serializer<(Diligent::SerializerMode)1> local_1c8;
  IMemoryAllocator *local_1b0;
  ConstQual<ShaderIndexArray> local_1a8;
  DeviceObjectArchive *local_198;
  _Hash_node_base *local_190;
  undefined1 local_188 [256];
  DynamicLinearAllocator local_88;
  int local_58 [10];
  
  if (this->m_ContentVersion != Src->m_ContentVersion) {
    in_R8 = (char *)&Src->m_ContentVersion;
    FormatString<char[51],unsigned_int,char[6],unsigned_int,char[3]>
              ((string *)local_188,(Diligent *)"Merging archives with different content versions (",
               (char (*) [51])&this->m_ContentVersion,(uint *)0x90f9ba,(char (*) [6])in_R8,
               (uint *)0x930cd5,in_stack_fffffffffffffe08);
    if (DebugMessageCallback != (undefined *)0x0) {
      in_R8 = (char *)0x0;
      (*(code *)DebugMessageCallback)(1,local_188._0_8_,0,0);
    }
    if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
      operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
    }
  }
  local_1b0 = GetRawAllocator();
  local_88.m_Blocks.
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_Blocks.
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.m_Blocks.
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_BlockSize = 0x200;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_1d8 = &this->m_DeviceShaders;
  lVar13 = 0;
  local_1d0 = Src;
  local_198 = this;
  local_88.m_pAllocator = local_1b0;
  do {
    lVar6 = (long)local_1d8->_M_elems[lVar13].
                  super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1d8->_M_elems[lVar13].
                  super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    local_58[lVar13] = (int)lVar6;
    pSVar12 = (Src->m_DeviceShaders)._M_elems[lVar13].
              super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar2 = (Src->m_DeviceShaders)._M_elems[lVar13].
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar12 != pSVar2) {
      pvVar3 = local_1d8->_M_elems;
      std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::reserve
                (pvVar3 + lVar13,((long)pSVar2 - (long)pSVar12 >> 5) + lVar6);
      pvVar10 = (Src->m_DeviceShaders)._M_elems + lVar13;
      pSVar2 = (pvVar10->
               super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pSVar12 = (pvVar10->
                     super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                     )._M_impl.super__Vector_impl_data._M_start; pSVar12 != pSVar2;
          pSVar12 = pSVar12 + 1) {
        SerializedData::MakeCopy((SerializedData *)local_188,pSVar12,local_1b0);
        std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
        emplace_back<Diligent::SerializedData>(pvVar3 + lVar13,(SerializedData *)local_188);
        SerializedData::~SerializedData((SerializedData *)local_188);
      }
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 7);
  pDVar9 = (DeviceObjectArchive *)(local_1d0->m_NamedResources)._M_h._M_before_begin._M_nxt;
  if (pDVar9 != (DeviceObjectArchive *)0x0) {
    do {
      uVar5 = (uint)(pDVar9->m_NamedResources)._M_h._M_bucket_count;
      local_1d8 = (array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
                   *)(ulong)uVar5;
      local_190 = (pDVar9->m_NamedResources)._M_h._M_before_begin._M_nxt;
      local_1f0._0_4_ = uVar5;
      HashMapStringKey::HashMapStringKey((HashMapStringKey *)(local_1f0 + 8),(Char *)local_190,true)
      ;
      this_00 = &(pDVar9->m_NamedResources)._M_h._M_rehash_policy;
      local_1d0 = pDVar9;
      ResourceData::MakeCopy((ResourceData *)local_188,(ResourceData *)this_00,local_1b0);
      pVar14 = std::
               _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::
               _M_emplace<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::DeviceObjectArchive::ResourceData>
                         ((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)local_198,local_1f0,(ResourceData *)local_188);
      _Var7 = pVar14.first.
              super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
              ._M_cur;
      lVar13 = 0xe0;
      do {
        SerializedData::~SerializedData((SerializedData *)(local_188 + lVar13));
        lVar13 = lVar13 + -0x20;
      } while (lVar13 != 0);
      SerializedData::~SerializedData((SerializedData *)local_188);
      if (((char *)local_1f0._8_8_ != (char *)0x0) && ((long)pcStack_1e0 < 0)) {
        operator_delete__((void *)local_1f0._8_8_);
      }
      local_1f0._8_8_ = (char *)0x0;
      pcStack_1e0 = (char *)0x0;
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        bVar4 = ResourceData::operator==
                          ((ResourceData *)
                           ((long)_Var7.
                                  super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                  ._M_cur + 0x20),(ResourceData *)this_00);
        if (!bVar4) {
          FormatString<char[26],char_const*,char[47]>
                    ((string *)local_188,(Diligent *)"Failed to copy resource \'",
                     (char (*) [26])&local_190,
                     (char **)"\': resource with the same name already exists.",(char (*) [47])in_R8
                    );
          if (DebugMessageCallback != (undefined *)0x0) {
            in_R8 = (char *)0x0;
            (*(code *)DebugMessageCallback)(1,local_188._0_8_,0,0);
          }
          if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
            operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
          }
        }
      }
      else {
        uVar5 = (int)local_1d8 - 3;
        if ((uVar5 < 4) || ((int)local_1d8 == 1)) {
          lVar13 = 0;
          do {
            if (*(long *)((long)_Var7.
                                super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                ._M_cur + 0x48 + lVar13 * 0x20) != 0) {
              iVar1 = local_58[lVar13];
              lVar6 = lVar13 * 0x20 +
                      (long)_Var7.
                            super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                            ._M_cur + 0x40;
              if ((int)local_1d8 == 1) {
                local_1c8.m_Start = (TPointer)((ulong)local_1c8.m_Start & 0xffffffff00000000);
                local_1f0._0_8_ = *(long *)(lVar6 + 8);
                local_1f0._8_8_ = local_1f0._0_8_ + *(long *)(lVar6 + 0x10);
                pcStack_1e0 = (char *)local_1f0._0_8_;
                bVar4 = Serializer<(Diligent::SerializerMode)0>::Copy<unsigned_int>
                                  ((Serializer<(Diligent::SerializerMode)0> *)local_1f0,
                                   (uint *)&local_1c8,4);
                if (!bVar4) {
                  in_R8 = 
                  "Failed to deserialize standalone shader index. Archive file may be corrupted or invalid."
                  ;
                  LogError<true,char[89]>
                            (false,"Merge",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                             ,0x271,(char (*) [89])
                                    "Failed to deserialize standalone shader index. Archive file may be corrupted or invalid."
                            );
                }
                if (pcStack_1e0 != (char *)local_1f0._8_8_) {
                  FormatString<char[51]>
                            ((string *)local_188,
                             (char (*) [51])"No other data besides the shader index is expected");
                  DebugAssertionFailed
                            ((Char *)local_188._0_8_,"Merge",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                             ,0x272);
                  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
                    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
                  }
                }
                local_1c8.m_Start =
                     (TPointer)CONCAT44(local_1c8.m_Start._4_4_,(int)local_1c8.m_Start + iVar1);
                local_1f0._0_8_ = *(undefined8 *)(lVar6 + 8);
                pcVar8 = (char *)(local_1f0._0_8_ + *(long *)(lVar6 + 0x10));
                local_1f0._8_8_ = pcVar8;
                pcStack_1e0 = (char *)local_1f0._0_8_;
                Serializer<(Diligent::SerializerMode)1>::Copy<unsigned_int_const>
                          ((Serializer<(Diligent::SerializerMode)1> *)local_1f0,(uint *)&local_1c8,4
                          );
                if (pcStack_1e0 != (char *)local_1f0._8_8_) {
                  FormatString<char[26],char[14]>
                            ((string *)local_188,(Diligent *)"Debug expression failed:\n",
                             (char (*) [26])0x803690,(char (*) [14])pcVar8);
                  DebugAssertionFailed
                            ((Char *)local_188._0_8_,"Merge",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                             ,0x27a);
LAB_006ab92c:
                  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
                    uVar11 = local_188._16_8_ + 1;
                    pcVar8 = (char *)local_188._0_8_;
                    goto LAB_006ab949;
                  }
                }
              }
              else {
                if (3 < uVar5) {
                  FormatString<char[25]>
                            ((string *)local_188,(char (*) [25])"Unexpected resource type");
                  DebugAssertionFailed
                            ((Char *)local_188._0_8_,"Merge",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                             ,0x294);
                  goto LAB_006ab92c;
                }
                local_1a8.pIndices = (uint *)0x0;
                local_1a8.Count = 0;
                local_1f0._0_8_ = *(undefined8 *)(lVar6 + 8);
                local_1f0._8_8_ = local_1f0._0_8_ + *(long *)(lVar6 + 0x10);
                pcStack_1e0 = (char *)local_1f0._0_8_;
                bVar4 = PSOSerializer<(Diligent::SerializerMode)0>::SerializeShaderIndices
                                  ((Serializer<(Diligent::SerializerMode)0> *)local_1f0,&local_1a8,
                                   &local_88);
                if (!bVar4) {
                  in_R8 = 
                  "Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid."
                  ;
                  LogError<true,char[84]>
                            (false,"Merge",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                             ,0x284,(char (*) [84])
                                    "Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid."
                            );
                }
                if (pcStack_1e0 != (char *)local_1f0._8_8_) {
                  FormatString<char[49]>
                            ((string *)local_188,
                             (char (*) [49])"No other data besides shader indices is expected");
                  DebugAssertionFailed
                            ((Char *)local_188._0_8_,"Merge",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                             ,0x285);
                  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
                    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
                  }
                }
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                vector<unsigned_int_const*,void>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_1f0,
                           local_1a8.pIndices,local_1a8.pIndices + local_1a8.Count,
                           (allocator_type *)local_188);
                for (pcVar8 = (char *)local_1f0._0_8_; pcVar8 != (char *)local_1f0._8_8_;
                    pcVar8 = pcVar8 + 4) {
                  *(int *)pcVar8 = *(int *)pcVar8 + iVar1;
                }
                Args_1 = *(char (**) [14])(lVar6 + 8);
                local_1c8.m_End = (TPointer)((long)*Args_1 + *(long *)(lVar6 + 0x10));
                local_188._0_8_ = local_1f0._0_8_;
                local_188._8_4_ = local_1a8.Count;
                local_1c8.m_Start = (TPointer)Args_1;
                local_1c8.m_Ptr = (TPointer)Args_1;
                PSOSerializer<(Diligent::SerializerMode)1>::SerializeShaderIndices
                          (&local_1c8,(ConstQual<ShaderIndexArray> *)local_188,
                           (DynamicLinearAllocator *)0x0);
                if (local_1c8.m_Ptr != local_1c8.m_End) {
                  FormatString<char[26],char[14]>
                            ((string *)local_188,(Diligent *)"Debug expression failed:\n",
                             (char (*) [26])0x803690,Args_1);
                  DebugAssertionFailed
                            ((Char *)local_188._0_8_,"Merge",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                             ,0x28f);
                  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
                    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
                  }
                }
                if ((char *)local_1f0._0_8_ == (char *)0x0) goto LAB_006ab94e;
                uVar11 = (long)pcStack_1e0 - local_1f0._0_8_;
                pcVar8 = (char *)local_1f0._0_8_;
LAB_006ab949:
                operator_delete(pcVar8,uVar11);
              }
            }
LAB_006ab94e:
            lVar13 = lVar13 + 1;
          } while (lVar13 != 7);
        }
      }
      pDVar9 = (DeviceObjectArchive *)(local_1d0->m_NamedResources)._M_h._M_buckets;
    } while (pDVar9 != (DeviceObjectArchive *)0x0);
  }
  DynamicLinearAllocator::~DynamicLinearAllocator(&local_88);
  return;
}

Assistant:

void DeviceObjectArchive::Merge(const DeviceObjectArchive& Src) noexcept(false)
{
    if (m_ContentVersion != Src.m_ContentVersion)
        LOG_WARNING_MESSAGE("Merging archives with different content versions (", m_ContentVersion, " and ", Src.m_ContentVersion, ").");

    static_assert(static_cast<size_t>(ResourceType::Count) == 8, "Did you add a new resource type? You may need to handle it here.");

    auto&                  Allocator = GetRawAllocator();
    DynamicLinearAllocator DynAllocator{Allocator, 512};

    // Copy shaders
    std::array<Uint32, static_cast<size_t>(DeviceType::Count)> ShaderBaseIndices{};
    for (size_t i = 0; i < m_DeviceShaders.size(); ++i)
    {
        const auto& SrcShaders = Src.m_DeviceShaders[i];
        auto&       DstShaders = m_DeviceShaders[i];
        ShaderBaseIndices[i]   = static_cast<Uint32>(DstShaders.size());
        if (SrcShaders.empty())
            continue;
        DstShaders.reserve(DstShaders.size() + SrcShaders.size());
        for (const auto& SrcShader : SrcShaders)
            DstShaders.emplace_back(SrcShader.MakeCopy(Allocator));
    }

    // Copy named resources
    for (auto& src_res_it : Src.m_NamedResources)
    {
        const auto  ResType = src_res_it.first.GetType();
        const auto* ResName = src_res_it.first.GetName();

        auto it_inserted = m_NamedResources.emplace(NamedResourceKey{ResType, ResName, /*CopyName = */ true}, src_res_it.second.MakeCopy(Allocator));
        if (!it_inserted.second)
        {
            // Silently skip duplicate resources
            if (it_inserted.first->second != src_res_it.second)
                LOG_WARNING_MESSAGE("Failed to copy resource '", ResName, "': resource with the same name already exists.");

            continue;
        }

        const auto IsStandaloneShader = (ResType == ResourceType::StandaloneShader);
        const auto IsPipeline =
            (ResType == ResourceType::GraphicsPipeline ||
             ResType == ResourceType::ComputePipeline ||
             ResType == ResourceType::RayTracingPipeline ||
             ResType == ResourceType::TilePipeline);

        // Update shader indices
        if (IsStandaloneShader || IsPipeline)
        {
            for (size_t i = 0; i < static_cast<size_t>(DeviceType::Count); ++i)
            {
                const auto BaseIdx = ShaderBaseIndices[i];

                auto& DeviceData = it_inserted.first->second.DeviceSpecific[i];
                if (!DeviceData)
                    continue;

                if (IsStandaloneShader)
                {
                    // For shaders, device-specific data is the serialized shader bytecode index
                    Uint32 ShaderIndex = 0;
                    {
                        Serializer<SerializerMode::Read> Ser{DeviceData};
                        if (!Ser(ShaderIndex))
                            LOG_ERROR_AND_THROW("Failed to deserialize standalone shader index. Archive file may be corrupted or invalid.");
                        VERIFY(Ser.IsEnded(), "No other data besides the shader index is expected");
                    }

                    ShaderIndex += BaseIdx;

                    {
                        Serializer<SerializerMode::Write> Ser{DeviceData};
                        Ser(ShaderIndex);
                        VERIFY_EXPR(Ser.IsEnded());
                    }
                }
                else if (IsPipeline)
                {
                    // For pipelines, device-specific data is the shader index array
                    ShaderIndexArray ShaderIndices;
                    {
                        Serializer<SerializerMode::Read> Ser{DeviceData};
                        if (!PSOSerializer<SerializerMode::Read>::SerializeShaderIndices(Ser, ShaderIndices, &DynAllocator))
                            LOG_ERROR_AND_THROW("Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid.");
                        VERIFY(Ser.IsEnded(), "No other data besides shader indices is expected");
                    }

                    std::vector<Uint32> NewIndices{ShaderIndices.pIndices, ShaderIndices.pIndices + ShaderIndices.Count};
                    for (auto& Idx : NewIndices)
                        Idx += BaseIdx;

                    {
                        Serializer<SerializerMode::Write> Ser{DeviceData};
                        PSOSerializer<SerializerMode::Write>::SerializeShaderIndices(Ser, ShaderIndexArray{NewIndices.data(), ShaderIndices.Count}, nullptr);
                        VERIFY_EXPR(Ser.IsEnded());
                    }
                }
                else
                {
                    UNEXPECTED("Unexpected resource type");
                }
            }
        }
    }
}